

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<13,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  Matrix<float,_2,_3> *pMVar3;
  undefined4 *puVar4;
  Matrix<float,_2,_3> *pMVar5;
  bool bVar6;
  undefined4 uVar7;
  Vector<float,_3> res;
  Type in0;
  float afStack_88 [6];
  float local_70 [6];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40 [6];
  Matrix<float,_2,_3> local_28;
  
  puVar1 = &local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pMVar3 = (Matrix<float,_2,_3> *)0x0;
    do {
      pMVar5 = (Matrix<float,_2,_3> *)0x0;
      do {
        uVar7 = 0x3f800000;
        if (pMVar3 != pMVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)(puVar1 + (long)pMVar5) = uVar7;
        pMVar5 = (Matrix<float,_2,_3> *)((long)(pMVar5->m_data).m_data[0].m_data + 1);
      } while (pMVar5 != (Matrix<float,_2,_3> *)0x3);
      pMVar5 = (Matrix<float,_2,_3> *)((long)(pMVar3->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      bVar6 = pMVar3 == (Matrix<float,_2,_3> *)0x0;
      pMVar3 = pMVar5;
    } while (bVar6);
    local_58 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_50 = *(undefined8 *)evalCtx->in[1].m_data;
    local_48 = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat3x2;
    pMVar3 = (Matrix<float,_2,_3> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)(puVar1 + lVar2) = puVar4[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      pMVar5 = (Matrix<float,_2,_3> *)((long)(pMVar3->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 3;
      bVar6 = pMVar3 == (Matrix<float,_2,_3> *)0x0;
      pMVar3 = pMVar5;
    } while (bVar6);
  }
  local_70[3] = (float)local_58 + local_58._4_4_;
  local_70[4] = (float)uStack_50 + uStack_50._4_4_;
  local_70[5] = (float)local_48 + local_48._4_4_;
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,3>
            (&local_28,(MatrixCaseUtils *)&local_58,pMVar5);
  local_70[0] = local_28.m_data.m_data[0].m_data[0] + local_28.m_data.m_data[0].m_data[1];
  local_70[1] = local_28.m_data.m_data[1].m_data[0] + local_28.m_data.m_data[1].m_data[1];
  local_70[2] = local_28.m_data.m_data[2].m_data[0] + local_28.m_data.m_data[2].m_data[1];
  afStack_88[2] = 0.0;
  afStack_88[3] = 0.0;
  afStack_88[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_88[lVar2 + 2] = local_70[lVar2 + 3] + local_70[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_40[2] = 0;
  local_40[3] = 1;
  local_40[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_40[lVar2]] = afStack_88[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(increment(in0));
	}